

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_parameter_validation.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZETParameterValidation::zetCommandListAppendMetricQueryEndPrologue
          (ZETParameterValidation *this,zet_command_list_handle_t hCommandList,
          zet_metric_query_handle_t hMetricQuery,ze_event_handle_t hSignalEvent,
          uint32_t numWaitEvents,ze_event_handle_t *phWaitEvents)

{
  ze_result_t zVar1;
  
  zVar1 = ZE_RESULT_ERROR_INVALID_SIZE;
  if (phWaitEvents != (ze_event_handle_t *)0x0) {
    zVar1 = ZE_RESULT_SUCCESS;
  }
  if (numWaitEvents == 0) {
    zVar1 = ZE_RESULT_SUCCESS;
  }
  if (hMetricQuery == (zet_metric_query_handle_t)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  if (hCommandList == (zet_command_list_handle_t)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  return zVar1;
}

Assistant:

ze_result_t
    ZETParameterValidation::zetCommandListAppendMetricQueryEndPrologue(
        zet_command_list_handle_t hCommandList,         ///< [in] handle of the command list
        zet_metric_query_handle_t hMetricQuery,         ///< [in] handle of the metric query
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in] must be zero
        ze_event_handle_t* phWaitEvents                 ///< [in][mbz] must be nullptr
        )
    {
        if( nullptr == hCommandList )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == hMetricQuery )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( (nullptr == phWaitEvents) && (0 < numWaitEvents) )
            return ZE_RESULT_ERROR_INVALID_SIZE;

        return ZE_RESULT_SUCCESS;
    }